

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNKalm.cpp
# Opt level: O0

void __thiscall NaPNKalman::relate_connectors(NaPNKalman *this)

{
  uint uVar1;
  NaVector *pNVar2;
  long in_RDI;
  
  uVar1 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x2b0));
  *(uint *)(in_RDI + 0x2a0) = uVar1;
  uVar1 = NaMatrix::dim_cols((NaMatrix *)(in_RDI + 0x2c8));
  *(uint *)(in_RDI + 0x2a8) = uVar1;
  uVar1 = NaMatrix::dim_rows((NaMatrix *)(in_RDI + 0x2e0));
  *(uint *)(in_RDI + 0x2a4) = uVar1;
  pNVar2 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x120));
  (*pNVar2->_vptr_NaVector[4])(pNVar2,(ulong)*(uint *)(in_RDI + 0x2a4));
  pNVar2 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x1a0));
  (*pNVar2->_vptr_NaVector[4])(pNVar2,(ulong)*(uint *)(in_RDI + 0x2a0));
  pNVar2 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0x220));
  (*pNVar2->_vptr_NaVector[4])(pNVar2,(ulong)*(uint *)(in_RDI + 0x2a0));
  return;
}

Assistant:

void
NaPNKalman::relate_connectors ()
{
    // initialize dimensions
    n = A.dim_rows();
    k = B.dim_cols();
    m = C.dim_rows();

    // Assign output dimensions
    y_obs.data().new_dim(m);
    x_int.data().new_dim(n);
    x_est.data().new_dim(n);
}